

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_detection.cpp
# Opt level: O3

void __thiscall ncnn::ObjectsManager::~ObjectsManager(ObjectsManager *this)

{
  SafeOrderList<ncnn::ObjectBox> *pSVar1;
  SafeOrderList<ncnn::ObjectBox> *pSVar2;
  pointer ppSVar3;
  SafeOrderList<ncnn::ObjectBox> *pSVar4;
  ulong uVar5;
  
  if (this->prob_steps != 0) {
    uVar5 = 0;
    do {
      pSVar1 = (this->object_boxs_table).
               super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar5];
      if (pSVar1 != (SafeOrderList<ncnn::ObjectBox> *)0x0) {
        pthread_mutex_destroy((pthread_mutex_t *)&pSVar1->mutex);
        pSVar4 = *(SafeOrderList<ncnn::ObjectBox> **)
                  &(pSVar1->container).
                   super__List_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>;
        while (pSVar4 != pSVar1) {
          pSVar2 = *(SafeOrderList<ncnn::ObjectBox> **)
                    &(pSVar4->container).
                     super__List_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>;
          operator_delete(pSVar4,0x28);
          pSVar4 = pSVar2;
        }
      }
      operator_delete(pSVar1,0x48);
      (this->object_boxs_table).
      super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar5] = (SafeOrderList<ncnn::ObjectBox> *)0x0;
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->prob_steps);
  }
  ppSVar3 = (this->object_boxs_table).
            super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->object_boxs_table).
      super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppSVar3) {
    (this->object_boxs_table).
    super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppSVar3;
  }
  if (ppSVar3 == (pointer)0x0) {
    return;
  }
  operator_delete(ppSVar3,(long)(this->object_boxs_table).
                                super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar3);
  return;
}

Assistant:

ObjectsManager::~ObjectsManager()
{
    for (int i = 0; i < prob_steps; i++)
    {
        delete object_boxs_table[i];
        object_boxs_table[i] = NULL;
    }
    object_boxs_table.clear();
}